

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O1

bool __thiscall
Rml::DataInterpreter::Execute
          (DataInterpreter *this,Instruction instruction,Variant *data,size_t *next_instruction)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pDVar3;
  AddressList *pAVar4;
  pointer pvVar5;
  pointer pVVar6;
  DataModel *this_00;
  code *pcVar7;
  bool bVar8;
  bool bVar9;
  byte bVar10;
  undefined4 uVar11;
  int iVar12;
  undefined7 extraout_var_00;
  char *pcVar13;
  ulong uVar14;
  string value;
  DataInterpreter *this_01;
  Variant *this_02;
  undefined8 uVar15;
  long lVar16;
  char cVar17;
  ulong uVar18;
  double value_00;
  String function_name;
  DataAddress address;
  String arguments_str;
  Vector<Variant> arguments;
  undefined1 local_1f8 [40];
  pointer local_1d0;
  undefined1 local_1c8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  undefined1 local_188 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_160;
  undefined1 local_158 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  undefined1 local_f8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  undefined1 local_b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  DataInterpreter *local_38;
  undefined7 extraout_var;
  
  uVar11 = local_1f8._4_4_;
  if (0x3b < (int)instruction) {
    switch(instruction) {
    case Less:
      local_1f8._0_8_ = (pointer)0x0;
      Variant::GetInto<double,_0>(&this->L,(double *)local_1f8);
      local_1d0 = (pointer)local_1f8._0_8_;
      local_1f8._0_8_ = (pointer)0x0;
      Variant::GetInto<double,_0>(&this->R,(double *)local_1f8);
      bVar8 = (double)local_1f8._0_8_ == (double)local_1d0;
      bVar9 = (double)local_1f8._0_8_ < (double)local_1d0;
      goto LAB_001f68ea;
    case Equal:
      if (((this->L).type != STRING) && ((this->R).type != STRING)) {
        local_1f8._0_8_ = (pointer)0x0;
        Variant::GetInto<double,_0>(&this->L,(double *)local_1f8);
        local_1d0 = (pointer)local_1f8._0_8_;
        local_1f8._0_8_ = (pointer)0x0;
        Variant::GetInto<double,_0>(&this->R,(double *)local_1f8);
        bVar8 = (double)local_1d0 == (double)local_1f8._0_8_;
LAB_001f6b85:
        value = (string)(-bVar8 & 1);
        goto LAB_001f6b00;
      }
      local_d8._8_8_ = 0;
      local_c8._M_local_buf[0] = '\0';
      local_d8._M_allocated_capacity = (size_type)&local_c8;
      Variant::
      GetInto<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&this->L,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_allocated_capacity == &local_c8) {
        local_198._8_8_ = local_c8._8_8_;
        local_1a8._M_allocated_capacity = (size_type)&local_198;
      }
      else {
        local_1a8._M_allocated_capacity = local_d8._M_allocated_capacity;
      }
      local_198._M_allocated_capacity._1_7_ = local_c8._M_allocated_capacity._1_7_;
      local_198._M_local_buf[0] = local_c8._M_local_buf[0];
      local_1a8._8_8_ = local_d8._8_8_;
      local_d8._8_8_ = 0;
      local_c8._M_local_buf[0] = '\0';
      pDVar3 = (pointer)(local_f8 + 0x10);
      local_f8._8_8_ = (pointer)0x0;
      local_f8[0x10] = '\0';
      local_f8._0_8_ = pDVar3;
      local_d8._M_allocated_capacity = (size_type)&local_c8;
      Variant::
      GetInto<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&this->R,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_f8);
      uVar15 = local_f8._8_8_;
      if ((pointer)local_f8._0_8_ == pDVar3) {
        local_1c8._24_8_ = local_f8._24_8_;
        local_1c8._0_8_ = (pointer)(local_1c8 + 0x10);
      }
      else {
        local_1c8._0_8_ = local_f8._0_8_;
      }
      local_1c8._17_7_ = local_f8._17_7_;
      local_1c8[0x10] = local_f8[0x10];
      local_1c8._8_8_ = local_f8._8_8_;
      local_f8._8_8_ = 0;
      local_f8[0x10] = '\0';
      if (local_1a8._8_8_ == uVar15) {
        if (local_1a8._8_8_ == 0) {
          bVar8 = true;
          local_f8._0_8_ = pDVar3;
        }
        else {
          local_f8._0_8_ = pDVar3;
          iVar12 = bcmp((void *)local_1a8._M_allocated_capacity,(void *)local_1c8._0_8_,
                        local_1a8._8_8_);
          bVar8 = iVar12 == 0;
        }
      }
      else {
        bVar8 = false;
        local_f8._0_8_ = pDVar3;
      }
      local_1f8._0_8_ = (pointer)0x2d;
      Variant::Set((Variant *)local_1f8,bVar8);
      Variant::operator=(&this->R,(Variant *)local_1f8);
      Variant::~Variant((Variant *)local_1f8);
      if ((pointer)local_1c8._0_8_ != (pointer)(local_1c8 + 0x10)) {
        operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
      }
      if ((pointer)local_f8._0_8_ != pDVar3) {
        operator_delete((void *)local_f8._0_8_,CONCAT71(local_f8._17_7_,local_f8[0x10]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_allocated_capacity != &local_198) {
        operator_delete((void *)local_1a8._M_allocated_capacity,local_198._M_allocated_capacity + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_allocated_capacity != &local_c8) {
        lVar16 = CONCAT71(local_c8._M_allocated_capacity._1_7_,local_c8._M_local_buf[0]);
        uVar15 = local_d8._M_allocated_capacity;
LAB_001f7710:
        operator_delete((void *)uVar15,lVar16 + 1);
      }
      break;
    case Greater:
      local_1f8._0_8_ = (pointer)0x0;
      Variant::GetInto<double,_0>(&this->L,(double *)local_1f8);
      local_1d0 = (pointer)local_1f8._0_8_;
      local_1f8._0_8_ = (pointer)0x0;
      Variant::GetInto<double,_0>(&this->R,(double *)local_1f8);
      bVar8 = (double)local_1d0 == (double)local_1f8._0_8_;
      bVar9 = (double)local_1d0 < (double)local_1f8._0_8_;
LAB_001f68ea:
      value = (string)(!bVar9 && !bVar8);
      goto LAB_001f6b00;
    case 0x3f:
    case 0x40:
    case 0x42:
    case 0x43:
    case 0x46:
    case 0x48:
    case 0x4b:
    case 0x4d:
    case 0x4f:
    case 0x51:
    case 0x52:
    case 0x53:
    case 0x55:
    case 0x57:
    case 0x58:
      goto switchD_001f653f_caseD_3f;
    case Assign:
      local_1f8._0_4_ = 0xffffffff;
      local_1f8._0_8_ = CONCAT44(uVar11,local_1f8._0_4_);
      Variant::GetInto<int,_0>(data,(int *)local_1f8);
      uVar14 = (ulong)(int)local_1f8._0_4_;
      pvVar5 = (this->addresses->
               super__Vector_base<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_std::allocator<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar18 = ((long)(this->addresses->
                      super__Vector_base<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_std::allocator<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5 >> 3) *
               -0x5555555555555555;
      if (uVar18 < uVar14 || uVar18 - uVar14 == 0) {
        local_1f8._0_8_ = local_1f8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1f8,"Variable address not found.","");
        bVar8 = Error(this,(String *)local_1f8);
LAB_001f6ddb:
        this = (DataInterpreter *)(ulong)bVar8;
        if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
LAB_001f6de6:
          operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
        }
LAB_001f6df3:
        bVar8 = false;
      }
      else {
        bVar8 = DataExpressionInterface::SetValue
                          (&this->expression_interface,pvVar5 + uVar14,&this->R);
        if (!bVar8) {
          local_1f8._0_8_ = local_1f8 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1f8,"Could not assign to variable.","");
          bVar8 = Error(this,(String *)local_1f8);
          goto LAB_001f6ddb;
        }
LAB_001f75a8:
        bVar8 = true;
      }
      bVar10 = (byte)this;
      goto joined_r0x001f6da6;
    case Literal:
      Variant::operator=(&this->R,data);
      break;
    case EventFnc:
    case TransformFnc:
      local_188._0_8_ = (pointer)0x0;
      local_188._8_8_ = (pointer)0x0;
      local_188._16_8_ = (pointer)0x0;
      bVar8 = ExtractArgumentsFromStack(this,(Vector<Variant> *)local_188);
      if (bVar8) {
        paVar2 = &local_78.field_2;
        local_78._M_string_length = 0;
        local_78.field_2._M_local_buf[0] = '\0';
        local_78._M_dataplus._M_p = (pointer)paVar2;
        Variant::
        GetInto<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (data,&local_78);
        paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_1f8 + 0x10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p == paVar2) {
          local_1f8._24_8_ = local_78.field_2._8_8_;
          local_1f8._0_8_ = paVar1;
        }
        else {
          local_1f8._0_8_ = local_78._M_dataplus._M_p;
        }
        local_1f8._17_7_ = local_78.field_2._M_allocated_capacity._1_7_;
        local_1f8[0x10] = local_78.field_2._M_local_buf[0];
        local_1f8._8_8_ = local_78._M_string_length;
        local_78._M_string_length = 0;
        local_78.field_2._M_local_buf[0] = '\0';
        local_38 = this;
        if (instruction == TransformFnc) {
          this_00 = (this->expression_interface).data_model;
          if (this_00 == (DataModel *)0x0) {
            uVar11 = 0;
            local_78._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_78._M_dataplus._M_p = (pointer)paVar2;
            bVar8 = DataModel::CallTransform
                              (this_00,(String *)local_1f8,(VariantList *)local_188,&this->R);
            uVar11 = (undefined4)CONCAT71(extraout_var,bVar8);
          }
        }
        else {
          local_78._M_dataplus._M_p = (pointer)paVar2;
          bVar8 = DataExpressionInterface::EventCallback
                            (&this->expression_interface,(String *)local_1f8,
                             (VariantList *)local_188);
          uVar11 = (undefined4)CONCAT71(extraout_var_00,bVar8);
        }
        if ((char)uVar11 == '\0') {
          local_1d0 = (pointer)CONCAT44(local_1d0._4_4_,uVar11);
          local_1a8._M_allocated_capacity = (size_type)&local_198;
          local_1a8._8_8_ = 0;
          local_198._M_allocated_capacity = local_198._M_allocated_capacity & 0xffffffffffffff00;
          local_160 = paVar1;
          if (local_188._8_8_ != local_188._0_8_) {
            pDVar3 = (pointer)(local_158 + 0x10);
            lVar16 = 0;
            uVar14 = 0;
            do {
              local_158._8_8_ = (pointer)0x0;
              local_158[0x10] = '\0';
              local_158._0_8_ = pDVar3;
              Variant::
              GetInto<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        ((Variant *)(local_188._0_8_ + lVar16),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_158);
              if ((pointer)local_158._0_8_ == pDVar3) {
                local_1c8._24_8_ = local_158._24_8_;
                local_1c8._0_8_ = (pointer)(local_1c8 + 0x10);
              }
              else {
                local_1c8._0_8_ = local_158._0_8_;
              }
              local_1c8._17_7_ = local_158._17_7_;
              local_1c8[0x10] = local_158[0x10];
              local_1c8._8_8_ = local_158._8_8_;
              local_158._8_8_ = 0;
              local_158[0x10] = '\0';
              local_158._0_8_ = pDVar3;
              ::std::__cxx11::string::_M_append(local_1a8._M_local_buf,local_1c8._0_8_);
              if ((pointer)local_1c8._0_8_ != (pointer)(local_1c8 + 0x10)) {
                operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
              }
              if ((pointer)local_158._0_8_ != pDVar3) {
                operator_delete((void *)local_158._0_8_,
                                CONCAT71(local_158._17_7_,local_158[0x10]) + 1);
              }
              if (uVar14 < ((long)(local_188._8_8_ - local_188._0_8_) >> 3) * -0x3333333333333333 -
                           1U) {
                ::std::__cxx11::string::append(local_1a8._M_local_buf);
              }
              uVar14 = uVar14 + 1;
              lVar16 = lVar16 + 0x28;
            } while (uVar14 < (ulong)(((long)(local_188._8_8_ - local_188._0_8_) >> 3) *
                                     -0x3333333333333333));
          }
          pcVar13 = "event callback";
          if (instruction == TransformFnc) {
            pcVar13 = "transform function";
          }
          CreateString_abi_cxx11_
                    ((String *)local_1c8,"Failed to execute %s: %s(%s)",pcVar13,local_1f8._0_8_,
                     local_1a8._M_allocated_capacity);
          bVar8 = Error(local_38,(String *)local_1c8);
          this = (DataInterpreter *)(ulong)bVar8;
          uVar11 = local_1d0._0_4_;
          if ((pointer)local_1c8._0_8_ != (pointer)(local_1c8 + 0x10)) {
            operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_allocated_capacity != &local_198) {
            operator_delete((void *)local_1a8._M_allocated_capacity,
                            local_198._M_allocated_capacity + 1);
          }
        }
        cVar17 = (char)uVar11;
        bVar10 = (byte)this;
        if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
          operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
        }
      }
      else {
        cVar17 = '\0';
        bVar10 = 0;
      }
      ::std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>::~vector
                ((vector<Rml::Variant,_std::allocator<Rml::Variant>_> *)local_188);
      if (cVar17 == '\0') goto LAB_001f6b1b;
      break;
    case GreaterEq:
      local_1f8._0_8_ = (pointer)0x0;
      Variant::GetInto<double,_0>(&this->L,(double *)local_1f8);
      local_1d0 = (pointer)local_1f8._0_8_;
      local_1f8._0_8_ = (pointer)0x0;
      Variant::GetInto<double,_0>(&this->R,(double *)local_1f8);
      bVar8 = (double)local_1d0 < (double)local_1f8._0_8_;
      goto LAB_001f6aef;
    case CastToInt:
      bVar8 = Variant::GetInto<int,_0>(&this->R,(int *)local_1a8._M_local_buf);
      if (bVar8) {
        Variant::Clear(&this->R);
        Variant::Set(&this->R,local_1a8._M_allocated_capacity._0_4_);
      }
      else {
        local_1f8._0_8_ = local_1f8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1f8,"Could not cast value to int.","");
        bVar9 = Error(this,(String *)local_1f8);
        this = (DataInterpreter *)(ulong)bVar9;
        if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
          operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
        }
      }
      bVar10 = (byte)this;
joined_r0x001f6da6:
      if (!bVar8) goto LAB_001f6b1b;
      break;
    case Jump:
switchD_001f653f_caseD_4a:
      local_1f8._0_8_ = (pointer)0x0;
      Variant::GetInto<unsigned_long,_0>(data,(unsigned_long *)local_1f8);
      *next_instruction = local_1f8._0_8_;
      break;
    case LessEq:
      local_1f8._0_8_ = (pointer)0x0;
      Variant::GetInto<double,_0>(&this->L,(double *)local_1f8);
      local_1d0 = (pointer)local_1f8._0_8_;
      local_1f8._0_8_ = (pointer)0x0;
      Variant::GetInto<double,_0>(&this->R,(double *)local_1f8);
      bVar8 = (double)local_1f8._0_8_ < (double)local_1d0;
LAB_001f6aef:
      value = (string)!bVar8;
      goto LAB_001f6b00;
    case NotEqual:
      if (((this->L).type != STRING) && ((this->R).type != STRING)) {
        local_1f8._0_8_ = (pointer)0x0;
        Variant::GetInto<double,_0>(&this->L,(double *)local_1f8);
        local_1d0 = (pointer)local_1f8._0_8_;
        local_1f8._0_8_ = (pointer)0x0;
        Variant::GetInto<double,_0>(&this->R,(double *)local_1f8);
        bVar8 = (double)local_1d0 != (double)local_1f8._0_8_;
        goto LAB_001f6b85;
      }
      local_118._8_8_ = 0;
      local_108._M_local_buf[0] = '\0';
      local_118._M_allocated_capacity = (size_type)&local_108;
      Variant::
      GetInto<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&this->L,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_allocated_capacity == &local_108) {
        local_198._8_8_ = local_108._8_8_;
        local_1a8._M_allocated_capacity = (size_type)&local_198;
      }
      else {
        local_1a8._M_allocated_capacity = local_118._M_allocated_capacity;
      }
      local_198._M_allocated_capacity._1_7_ = local_108._M_allocated_capacity._1_7_;
      local_198._M_local_buf[0] = local_108._M_local_buf[0];
      local_1a8._8_8_ = local_118._8_8_;
      local_118._8_8_ = 0;
      local_108._M_local_buf[0] = '\0';
      local_138._8_8_ = (pointer)0x0;
      local_128._M_local_buf[0] = '\0';
      local_138._M_allocated_capacity = (size_type)&local_128;
      local_118._M_allocated_capacity = (size_type)&local_108;
      Variant::
      GetInto<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&this->R,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_138);
      uVar15 = local_138._8_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_allocated_capacity == &local_128) {
        local_1c8._24_8_ = local_128._8_8_;
        local_1c8._0_8_ = (pointer)(local_1c8 + 0x10);
      }
      else {
        local_1c8._0_8_ = local_138._M_allocated_capacity;
      }
      local_1c8._17_7_ = local_128._M_allocated_capacity._1_7_;
      local_1c8[0x10] = local_128._M_local_buf[0];
      local_1c8._8_8_ = local_138._8_8_;
      local_138._8_8_ = 0;
      local_128._M_local_buf[0] = '\0';
      bVar8 = true;
      local_138._M_allocated_capacity = (size_type)&local_128;
      if (local_1a8._8_8_ == uVar15) {
        if (local_1a8._8_8_ == 0) {
          bVar8 = false;
        }
        else {
          iVar12 = bcmp((void *)local_1a8._M_allocated_capacity,(void *)local_1c8._0_8_,
                        local_1a8._8_8_);
          bVar8 = iVar12 != 0;
        }
      }
      local_1f8._0_8_ = (pointer)0x2d;
      Variant::Set((Variant *)local_1f8,bVar8);
      Variant::operator=(&this->R,(Variant *)local_1f8);
      Variant::~Variant((Variant *)local_1f8);
      if ((pointer)local_1c8._0_8_ != (pointer)(local_1c8 + 0x10)) {
        operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_allocated_capacity != &local_128) {
        operator_delete((void *)local_138._M_allocated_capacity,
                        CONCAT71(local_128._M_allocated_capacity._1_7_,local_128._M_local_buf[0]) +
                        1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_allocated_capacity != &local_198) {
        operator_delete((void *)local_1a8._M_allocated_capacity,local_198._M_allocated_capacity + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_allocated_capacity != &local_108) {
        lVar16 = CONCAT71(local_108._M_allocated_capacity._1_7_,local_108._M_local_buf[0]);
        uVar15 = local_118._M_allocated_capacity;
        goto LAB_001f7710;
      }
      break;
    case Push:
      ::std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>::emplace_back<Rml::Variant>
                (&this->stack,&this->R);
      Variant::Clear(&this->R);
      break;
    case Variable:
      local_1f8._0_4_ = 0xffffffff;
      local_1f8._0_8_ = CONCAT44(uVar11,local_1f8._0_4_);
      Variant::GetInto<int,_0>(data,(int *)local_1f8);
      uVar14 = (ulong)(int)local_1f8._0_4_;
      pAVar4 = this->addresses;
      uVar18 = ((long)(pAVar4->
                      super__Vector_base<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_std::allocator<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(pAVar4->
                      super__Vector_base<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_std::allocator<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      if (uVar18 < uVar14 || uVar18 - uVar14 == 0) {
        local_1f8._0_8_ = local_1f8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1f8,"Variable address not found.","");
        bVar8 = Error(this,(String *)local_1f8);
        this = (DataInterpreter *)(ulong)bVar8;
        if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
          operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
        }
      }
      else {
        DataExpressionInterface::GetValue
                  ((Variant *)local_1f8,&this->expression_interface,
                   (pAVar4->
                   super__Vector_base<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_std::allocator<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar14);
        Variant::operator=(&this->R,(Variant *)local_1f8);
        Variant::~Variant((Variant *)local_1f8);
      }
      bVar10 = (byte)this;
      if (uVar18 < uVar14 || uVar18 - uVar14 == 0) goto LAB_001f6b1b;
      break;
    case DynamicVariable:
      paVar1 = &local_58.field_2;
      local_58._M_string_length = 0;
      local_58.field_2._M_local_buf[0] = '\0';
      local_58._M_dataplus._M_p = (pointer)paVar1;
      Variant::
      GetInto<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&this->R,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p == paVar1) {
        local_198._8_8_ = local_58.field_2._8_8_;
        local_1a8._M_allocated_capacity = (size_type)&local_198;
      }
      else {
        local_1a8._M_allocated_capacity = (size_type)local_58._M_dataplus._M_p;
      }
      local_198._M_allocated_capacity._1_7_ = local_58.field_2._M_allocated_capacity._1_7_;
      local_198._M_local_buf[0] = local_58.field_2._M_local_buf[0];
      local_1a8._8_8_ = local_58._M_string_length;
      local_58._M_string_length = 0;
      local_58.field_2._M_local_buf[0] = '\0';
      local_58._M_dataplus._M_p = (pointer)paVar1;
      DataExpressionInterface::ParseAddress
                ((DataAddress *)local_1c8,&this->expression_interface,(String *)&local_1a8);
      if (local_1c8._0_8_ == local_1c8._8_8_) {
        local_1f8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_1f8 + 0x10);
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1f8,"Variable address not found.","");
        bVar8 = Error(this,(String *)local_1f8);
        this = (DataInterpreter *)(ulong)bVar8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_1f8 + 0x10)) {
          operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
        }
      }
      else {
        DataExpressionInterface::GetValue
                  ((Variant *)local_1f8,&this->expression_interface,(DataAddress *)local_1c8);
        Variant::operator=(&this->R,(Variant *)local_1f8);
        Variant::~Variant((Variant *)local_1f8);
      }
      bVar10 = (byte)this;
      ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::~vector
                ((vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> *)local_1c8)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_allocated_capacity != &local_198) {
        operator_delete((void *)local_1a8._M_allocated_capacity,local_198._M_allocated_capacity + 1)
        ;
      }
      if (local_1c8._0_8_ == local_1c8._8_8_) goto LAB_001f6b1b;
      break;
    case JumpIfZero:
      local_1f8._0_8_ = (ulong)(uint7)local_1f8._1_7_ << 8;
      Variant::GetInto<bool,_0>(&this->R,(bool *)local_1f8);
      if (local_1f8[0] == (string)0x0) goto switchD_001f653f_caseD_4a;
      break;
    default:
      if (instruction == Pop) {
        if ((this->stack).super__Vector_base<Rml::Variant,_std::allocator<Rml::Variant>_>._M_impl.
            super__Vector_impl_data._M_start ==
            (this->stack).super__Vector_base<Rml::Variant,_std::allocator<Rml::Variant>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          local_1f8._0_8_ = local_1f8 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1f8,"Cannot pop stack, it is empty.","");
          bVar10 = Error(this,(String *)local_1f8);
          if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
            operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
          }
          goto LAB_001f6b1b;
        }
        local_1f8._0_4_ = 0xffffffff;
        local_1f8._0_8_ = CONCAT44(uVar11,local_1f8._0_4_);
        Variant::GetInto<int,_0>(data,(int *)local_1f8);
        if (local_1f8._0_4_ == 1) {
          pVVar6 = (this->stack).super__Vector_base<Rml::Variant,_std::allocator<Rml::Variant>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          this_01 = (DataInterpreter *)&this->L;
LAB_001f7592:
          Variant::operator=(&this_01->R,pVVar6 + -1);
          this_02 = (this->stack).super__Vector_base<Rml::Variant,_std::allocator<Rml::Variant>_>.
                    _M_impl.super__Vector_impl_data._M_finish + -1;
          (this->stack).super__Vector_base<Rml::Variant,_std::allocator<Rml::Variant>_>._M_impl.
          super__Vector_impl_data._M_finish = this_02;
          Variant::~Variant(this_02);
          goto LAB_001f75a8;
        }
        if (local_1f8._0_4_ == 0) {
          pVVar6 = (this->stack).super__Vector_base<Rml::Variant,_std::allocator<Rml::Variant>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          this_01 = this;
          goto LAB_001f7592;
        }
        CreateString_abi_cxx11_((String *)local_1f8,"Invalid register %d.");
        bVar8 = Error(this,(String *)local_1f8);
        this = (DataInterpreter *)(ulong)bVar8;
        if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) goto LAB_001f6de6;
        goto LAB_001f6df3;
      }
      if (instruction == Or) {
        local_1f8._0_8_ = (ulong)(uint7)local_1f8._1_7_ << 8;
        Variant::GetInto<bool,_0>(&this->L,(bool *)local_1f8);
        value = (string)0x1;
        if (local_1f8[0] == (string)0x0) {
          local_1f8._0_8_ = local_1f8._0_8_ & 0xffffffffffffff00;
          Variant::GetInto<bool,_0>(&this->R,(bool *)local_1f8);
          value = local_1f8[0];
        }
        goto LAB_001f6b00;
      }
      goto switchD_001f653f_caseD_3f;
    }
    goto LAB_001f6b18;
  }
  switch(instruction) {
  case Not:
    local_1f8._0_8_ = (ulong)(uint7)local_1f8._1_7_ << 8;
    Variant::GetInto<bool,_0>(&this->R,(bool *)local_1f8);
    value = (string)((byte)local_1f8[0] ^ 1);
    goto LAB_001f6b00;
  default:
    goto switchD_001f653f_caseD_3f;
  case NumArguments:
    local_1f8._0_4_ = 0xffffffff;
    local_1f8._0_8_ = CONCAT44(uVar11,local_1f8._0_4_);
    Variant::GetInto<int,_0>(data,(int *)local_1f8);
    uVar11 = local_1f8._0_4_;
    Variant::Clear(&this->R);
    Variant::Set(&this->R,uVar11);
    goto LAB_001f6b18;
  case And:
    local_1f8._0_8_ = (ulong)(uint7)local_1f8._1_7_ << 8;
    Variant::GetInto<bool,_0>(&this->L,(bool *)local_1f8);
    if (local_1f8[0] == (string)0x1) {
      local_1f8._0_8_ = local_1f8._0_8_ & 0xffffffffffffff00;
      Variant::GetInto<bool,_0>(&this->R,(bool *)local_1f8);
      value = local_1f8[0];
    }
    else {
      value = (string)0x0;
    }
LAB_001f6b00:
    local_1f8._0_8_ = (pointer)0x2d;
    Variant::Set((Variant *)local_1f8,(bool)value);
    goto LAB_001f6b05;
  case Multiply:
    local_1f8._0_8_ = (pointer)0x0;
    Variant::GetInto<double,_0>(&this->L,(double *)local_1f8);
    local_1d0 = (pointer)local_1f8._0_8_;
    local_1f8._0_8_ = (pointer)0x0;
    Variant::GetInto<double,_0>(&this->R,(double *)local_1f8);
    value_00 = (double)local_1d0 * (double)local_1f8._0_8_;
    break;
  case Add:
    if (((this->L).type != STRING) && ((this->R).type != STRING)) {
      local_1f8._0_8_ = (pointer)0x0;
      Variant::GetInto<double,_0>(&this->L,(double *)local_1f8);
      local_1d0 = (pointer)local_1f8._0_8_;
      local_1f8._0_8_ = (pointer)0x0;
      Variant::GetInto<double,_0>(&this->R,(double *)local_1f8);
      value_00 = (double)local_1d0 + (double)local_1f8._0_8_;
      break;
    }
    paVar1 = &local_98.field_2;
    local_98._M_string_length = 0;
    local_98.field_2._M_local_buf[0] = '\0';
    local_98._M_dataplus._M_p = (pointer)paVar1;
    Variant::
    GetInto<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&this->L,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == paVar1) {
      local_1c8._24_8_ = local_98.field_2._8_8_;
      local_1c8._0_8_ = (pointer)(local_1c8 + 0x10);
    }
    else {
      local_1c8._0_8_ = local_98._M_dataplus._M_p;
    }
    local_1c8._17_7_ = local_98.field_2._M_allocated_capacity._1_7_;
    local_1c8[0x10] = local_98.field_2._M_local_buf[0];
    local_1c8._8_8_ = local_98._M_string_length;
    local_98._M_string_length = 0;
    local_98.field_2._M_local_buf[0] = '\0';
    pVVar6 = (pointer)(local_b8 + 0x10);
    local_b8._8_8_ = (pointer)0x0;
    local_b8[0x10] = '\0';
    local_b8._0_8_ = pVVar6;
    local_98._M_dataplus._M_p = (pointer)paVar1;
    Variant::
    GetInto<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&this->R,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_b8);
    if ((pointer)local_b8._0_8_ == pVVar6) {
      local_188._24_8_ = local_b8._24_8_;
      local_188._0_8_ = (pointer)(local_188 + 0x10);
    }
    else {
      local_188._0_8_ = local_b8._0_8_;
    }
    local_188._17_7_ = local_b8._17_7_;
    local_188[0x10] = local_b8[0x10];
    local_188._8_8_ = local_b8._8_8_;
    local_b8._8_8_ = 0;
    local_b8[0x10] = '\0';
    local_b8._0_8_ = pVVar6;
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a8
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188
                    );
    local_1f8._0_8_ = (pointer)0x2d;
    Variant::Set((Variant *)local_1f8,(String *)&local_1a8);
    Variant::operator=(&this->R,(Variant *)local_1f8);
    Variant::~Variant((Variant *)local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_allocated_capacity != &local_198) {
      operator_delete((void *)local_1a8._M_allocated_capacity,local_198._M_allocated_capacity + 1);
    }
    if ((pointer)local_188._0_8_ != (pointer)(local_188 + 0x10)) {
      operator_delete((void *)local_188._0_8_,(ulong)(local_188._16_8_ + 1));
    }
    if ((pointer)local_b8._0_8_ != pVVar6) {
      operator_delete((void *)local_b8._0_8_,CONCAT71(local_b8._17_7_,local_b8[0x10]) + 1);
    }
    if ((pointer)local_1c8._0_8_ != (pointer)(local_1c8 + 0x10)) {
      operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      lVar16 = CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                        local_98.field_2._M_local_buf[0]);
      uVar15 = local_98._M_dataplus._M_p;
      goto LAB_001f7710;
    }
    goto LAB_001f6b18;
  case Subtract:
    local_1f8._0_8_ = (pointer)0x0;
    Variant::GetInto<double,_0>(&this->L,(double *)local_1f8);
    local_1d0 = (pointer)local_1f8._0_8_;
    local_1f8._0_8_ = (pointer)0x0;
    Variant::GetInto<double,_0>(&this->R,(double *)local_1f8);
    value_00 = (double)local_1d0 - (double)local_1f8._0_8_;
    break;
  case Divide:
    local_1f8._0_8_ = (pointer)0x0;
    Variant::GetInto<double,_0>(&this->L,(double *)local_1f8);
    local_1d0 = (pointer)local_1f8._0_8_;
    local_1f8._0_8_ = (pointer)0x0;
    Variant::GetInto<double,_0>(&this->R,(double *)local_1f8);
    value_00 = (double)local_1d0 / (double)local_1f8._0_8_;
  }
  local_1f8._0_8_ = (pointer)0x2d;
  Variant::Set((Variant *)local_1f8,value_00);
LAB_001f6b05:
  Variant::operator=(&this->R,(Variant *)local_1f8);
  Variant::~Variant((Variant *)local_1f8);
LAB_001f6b18:
  bVar10 = 1;
LAB_001f6b1b:
  return (bool)(bVar10 & 1);
switchD_001f653f_caseD_3f:
  bVar8 = Assert("Instruction not implemented.",
                 "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataExpression.cpp"
                 ,0x465);
  if (!bVar8) {
    pcVar7 = (code *)invalidInstructionException();
    (*pcVar7)();
  }
  goto LAB_001f6b18;
}

Assistant:

bool Execute(const Instruction instruction, const Variant& data, size_t& next_instruction)
	{
		auto AnyString = [](const Variant& v1, const Variant& v2) { return v1.GetType() == Variant::STRING || v2.GetType() == Variant::STRING; };

		switch (instruction)
		{
		case Instruction::Push:
		{
			stack.push_back(std::move(R));
			R.Clear();
		}
		break;
		case Instruction::Pop:
		{
			if (stack.empty())
				return Error("Cannot pop stack, it is empty.");

			Register reg = Register(data.Get<int>(-1));
			switch (reg)
			{
				// clang-format off
			case Register::R:  R = stack.back(); stack.pop_back(); break;
			case Register::L:  L = stack.back(); stack.pop_back(); break;
				// clang-format on
			default: return Error(CreateString("Invalid register %d.", int(reg)));
			}
		}
		break;
		case Instruction::Literal:
		{
			R = data;
		}
		break;
		case Instruction::DynamicVariable:
		{
			auto str = R.Get<String>();
			auto address = expression_interface.ParseAddress(str);
			if (address.empty())
				return Error("Variable address not found.");
			R = expression_interface.GetValue(address);
		}
		break;
		case Instruction::Variable:
		{
			size_t variable_index = size_t(data.Get<int>(-1));
			if (variable_index < addresses.size())
				R = expression_interface.GetValue(addresses[variable_index]);
			else
				return Error("Variable address not found.");
		}
		break;
		case Instruction::Add:
		{
			if (AnyString(L, R))
				R = Variant(L.Get<String>() + R.Get<String>());
			else
				R = Variant(L.Get<double>() + R.Get<double>());
		}
		break;
			// clang-format off
		case Instruction::Subtract:  R = Variant(L.Get<double>() - R.Get<double>());  break;
		case Instruction::Multiply:  R = Variant(L.Get<double>() * R.Get<double>());  break;
		case Instruction::Divide:    R = Variant(L.Get<double>() / R.Get<double>());  break;
		case Instruction::Not:       R = Variant(!R.Get<bool>());                     break;
		case Instruction::And:       R = Variant(L.Get<bool>() && R.Get<bool>());     break;
		case Instruction::Or:        R = Variant(L.Get<bool>() || R.Get<bool>());     break;
		case Instruction::Less:      R = Variant(L.Get<double>() < R.Get<double>());  break;
		case Instruction::LessEq:    R = Variant(L.Get<double>() <= R.Get<double>()); break;
		case Instruction::Greater:   R = Variant(L.Get<double>() > R.Get<double>());  break;
		case Instruction::GreaterEq: R = Variant(L.Get<double>() >= R.Get<double>()); break;
			// clang-format on
		case Instruction::Equal:
		{
			if (AnyString(L, R))
				R = Variant(L.Get<String>() == R.Get<String>());
			else
				R = Variant(L.Get<double>() == R.Get<double>());
		}
		break;
		case Instruction::NotEqual:
		{
			if (AnyString(L, R))
				R = Variant(L.Get<String>() != R.Get<String>());
			else
				R = Variant(L.Get<double>() != R.Get<double>());
		}
		break;
		case Instruction::NumArguments:
		{
			const int num_arguments = data.Get<int>(-1);
			R = num_arguments;
		}
		break;
		case Instruction::TransformFnc:
		case Instruction::EventFnc:
		{
			Vector<Variant> arguments;
			if (!ExtractArgumentsFromStack(arguments))
				return false;

			const String function_name = data.Get<String>();
			const bool result = (instruction == Instruction::TransformFnc ? expression_interface.CallTransform(function_name, arguments, R)
																		  : expression_interface.EventCallback(function_name, arguments));
			if (!result)
			{
				String arguments_str;
				for (size_t i = 0; i < arguments.size(); i++)
				{
					arguments_str += arguments[i].Get<String>();
					if (i < arguments.size() - 1)
						arguments_str += ", ";
				}
				return Error(
					CreateString("Failed to execute %s: %s(%s)", instruction == Instruction::TransformFnc ? "transform function" : "event callback",
						function_name.c_str(), arguments_str.c_str()));
			}
		}
		break;
		case Instruction::Assign:
		{
			size_t variable_index = size_t(data.Get<int>(-1));
			if (variable_index < addresses.size())
			{
				if (!expression_interface.SetValue(addresses[variable_index], R))
					return Error("Could not assign to variable.");
			}
			else
				return Error("Variable address not found.");
		}
		break;
		case Instruction::CastToInt:
		{
			int tmp;
			if (!R.GetInto(tmp))
				return Error("Could not cast value to int.");
			else
				R = tmp;
		}
		break;
		case Instruction::JumpIfZero:
		{
			if (!R.Get<bool>())
				next_instruction = data.Get<size_t>(0);
		}
		break;
		case Instruction::Jump:
		{
			next_instruction = data.Get<size_t>(0);
		}
		break;
		default: RMLUI_ERRORMSG("Instruction not implemented."); break;
		}
		return true;
	}